

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTDMT_toFlushNow(ZSTDMT_CCtx *mtctx)

{
  ZSTDMT_jobDescription *pZVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ZSTDMT_jobDescription *pZVar6;
  size_t sVar7;
  
  uVar4 = mtctx->doneJobID;
  if (mtctx->nextJobID < uVar4) {
    __assert_fail("jobID <= mtctx->nextJobID",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8947,"size_t ZSTDMT_toFlushNow(ZSTDMT_CCtx *)");
  }
  if (uVar4 == mtctx->nextJobID) {
    sVar7 = 0;
  }
  else {
    uVar4 = uVar4 & mtctx->jobIDMask;
    pZVar1 = mtctx->jobs;
    pZVar6 = pZVar1 + uVar4;
    pthread_mutex_lock((pthread_mutex_t *)&pZVar1[uVar4].job_mutex);
    uVar5 = 0;
    uVar3 = uVar5;
    if (pZVar1[uVar4].cSize < 0xffffffffffffff89) {
      uVar5 = pZVar6->dstFlushed;
      uVar3 = pZVar1[uVar4].cSize;
    }
    if (uVar3 < uVar5) {
      __assert_fail("flushed <= produced",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8951,"size_t ZSTDMT_toFlushNow(ZSTDMT_CCtx *)");
    }
    uVar2 = (pZVar6->src).size;
    if (uVar2 < pZVar6->consumed) {
      __assert_fail("jobPtr->consumed <= jobPtr->src.size",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8952,"size_t ZSTDMT_toFlushNow(ZSTDMT_CCtx *)");
    }
    sVar7 = uVar3 - uVar5;
    if ((sVar7 == 0) && (uVar2 <= pZVar6->consumed)) {
      __assert_fail("jobPtr->consumed < jobPtr->src.size",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x895a,"size_t ZSTDMT_toFlushNow(ZSTDMT_CCtx *)");
    }
    pthread_mutex_unlock((pthread_mutex_t *)&mtctx->jobs[uVar4].job_mutex);
  }
  return sVar7;
}

Assistant:

size_t ZSTDMT_toFlushNow(ZSTDMT_CCtx* mtctx)
{
    size_t toFlush;
    unsigned const jobID = mtctx->doneJobID;
    assert(jobID <= mtctx->nextJobID);
    if (jobID == mtctx->nextJobID) return 0;   /* no active job => nothing to flush */

    /* look into oldest non-fully-flushed job */
    {   unsigned const wJobID = jobID & mtctx->jobIDMask;
        ZSTDMT_jobDescription* const jobPtr = &mtctx->jobs[wJobID];
        ZSTD_pthread_mutex_lock(&jobPtr->job_mutex);
        {   size_t const cResult = jobPtr->cSize;
            size_t const produced = ZSTD_isError(cResult) ? 0 : cResult;
            size_t const flushed = ZSTD_isError(cResult) ? 0 : jobPtr->dstFlushed;
            assert(flushed <= produced);
            assert(jobPtr->consumed <= jobPtr->src.size);
            toFlush = produced - flushed;
            /* if toFlush==0, nothing is available to flush.
             * However, jobID is expected to still be active:
             * if jobID was already completed and fully flushed,
             * ZSTDMT_flushProduced() should have already moved onto next job.
             * Therefore, some input has not yet been consumed. */
            if (toFlush==0) {
                assert(jobPtr->consumed < jobPtr->src.size);
            }
        }
        ZSTD_pthread_mutex_unlock(&mtctx->jobs[wJobID].job_mutex);
    }

    return toFlush;
}